

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

SourceDynamicProfileManager *
Js::SourceDynamicProfileManager::Deserialize<Js::BufferReader>
          (BufferReader *reader,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BVFixed *data;
  size_t len;
  Recycler *pRVar4;
  SourceDynamicProfileManager *this;
  DynamicProfileInfo *local_90;
  DynamicProfileInfo *dynamicProfileInfo;
  LocalFunctionId functionId;
  uint i;
  undefined8 local_78;
  TrackAllocData local_70;
  SourceDynamicProfileManager *local_48;
  SourceDynamicProfileManager *sourceDynamicProfileManager;
  ThreadContext *threadContext;
  BVFixed *pBStack_30;
  uint profileCount;
  BVFixed *startupFunctions;
  Recycler *pRStack_20;
  uint functionCount;
  Recycler *recycler_local;
  BufferReader *reader_local;
  
  pRStack_20 = recycler;
  recycler_local = (Recycler *)reader;
  bVar2 = BufferReader::Peek<unsigned_int>(reader,(uint *)((long)&startupFunctions + 4));
  if (bVar2) {
    data = BVFixed::New<Memory::Recycler>(startupFunctions._4_4_,pRStack_20,false);
    pRVar4 = recycler_local;
    pBStack_30 = data;
    len = BVFixed::GetAllocSize(startupFunctions._4_4_);
    bVar2 = BufferReader::ReadArray<char>((BufferReader *)pRVar4,(char *)data,len);
    if (bVar2) {
      bVar2 = BufferReader::Read<unsigned_int>
                        ((BufferReader *)recycler_local,(uint *)((long)&threadContext + 4));
      if (bVar2) {
        sourceDynamicProfileManager =
             (SourceDynamicProfileManager *)ThreadContext::GetContextForCurrentThread();
        pRVar4 = ThreadContext::GetRecycler((ThreadContext *)sourceDynamicProfileManager);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_70,(type_info *)&typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                   ,0x15b);
        pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_70);
        _functionId = Memory::Recycler::AllocInlined;
        local_78 = 0;
        this = (SourceDynamicProfileManager *)new<Memory::Recycler>(0x98,pRVar4,0x43c4b0);
        SourceDynamicProfileManager(this,pRStack_20);
        local_48 = this;
        Memory::WriteBarrierPtr<const_BVFixed>::operator=(&this->cachedStartupFunctions,pBStack_30);
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01ea1258,DynamicProfilePhase);
        if (bVar2) {
          Output::Print(L"Loaded: Startup functions bit vector:");
          BVFixed::Dump(pBStack_30);
        }
        for (dynamicProfileInfo._4_4_ = 0; dynamicProfileInfo._4_4_ < threadContext._4_4_;
            dynamicProfileInfo._4_4_ = dynamicProfileInfo._4_4_ + 1) {
          local_90 = DynamicProfileInfo::Deserialize<Js::BufferReader>
                               ((BufferReader *)recycler_local,pRStack_20,
                                (LocalFunctionId *)&dynamicProfileInfo);
          if ((local_90 == (DynamicProfileInfo *)0x0) ||
             (startupFunctions._4_4_ <= (uint)dynamicProfileInfo)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                        ,0x16d,"(false)","false");
            if (bVar2) {
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar3 = 0;
              return (SourceDynamicProfileManager *)0x0;
            }
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          JsUtil::
          BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Add(&local_48->dynamicProfileInfoMap,(uint *)&dynamicProfileInfo,&local_90);
          AddSavingItem(local_48,(uint)dynamicProfileInfo,local_90);
        }
        reader_local = (BufferReader *)local_48;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                    ,0x155,"(false)","false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
        reader_local = (BufferReader *)0x0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                  ,0x14d,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
      reader_local = (BufferReader *)0x0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x145,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    reader_local = (BufferReader *)0x0;
  }
  return (SourceDynamicProfileManager *)reader_local;
}

Assistant:

SourceDynamicProfileManager *
    SourceDynamicProfileManager::Deserialize(T * reader, Recycler* recycler)
    {
        uint functionCount;
        if (!reader->Peek(&functionCount))
        {
            Assert(false);
            return nullptr;
        }

        BVFixed * startupFunctions = BVFixed::New(functionCount, recycler);
        if (!reader->ReadArray(((char *)startupFunctions),
            BVFixed::GetAllocSize(functionCount)))
        {
            Assert(false);
            return nullptr;
        }

        uint profileCount;

        if (!reader->Read(&profileCount))
        {
            Assert(false);
            return nullptr;
        }

        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();

        SourceDynamicProfileManager * sourceDynamicProfileManager = RecyclerNew(threadContext->GetRecycler(), SourceDynamicProfileManager, recycler);

        sourceDynamicProfileManager->cachedStartupFunctions = startupFunctions;

#if DBG_DUMP
        if(Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase))
        {
            Output::Print(_u("Loaded: Startup functions bit vector:"));
            startupFunctions->Dump();
        }
#endif

        for (uint i = 0; i < profileCount; i++)
        {
            Js::LocalFunctionId functionId;
            DynamicProfileInfo * dynamicProfileInfo = DynamicProfileInfo::Deserialize(reader, recycler, &functionId);
            if (dynamicProfileInfo == nullptr || functionId >= functionCount)
            {
                Assert(false);
                return nullptr;
            }
            sourceDynamicProfileManager->dynamicProfileInfoMap.Add(functionId, dynamicProfileInfo);
            sourceDynamicProfileManager->AddSavingItem(functionId, dynamicProfileInfo);
        }
        return sourceDynamicProfileManager;
    }